

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astr.c
# Opt level: O0

void print_escaped_astr(FILE *out,astr *astr)

{
  byte bVar1;
  int local_1c;
  uchar c;
  int i;
  astr *astr_local;
  FILE *out_local;
  
  fprintf((FILE *)out,"\"");
  for (local_1c = 0; (ulong)(long)local_1c < astr->len; local_1c = local_1c + 1) {
    bVar1 = astr->str[local_1c];
    if (bVar1 == 7) {
      fprintf((FILE *)out,"\\a");
    }
    else if (bVar1 == 9) {
      fprintf((FILE *)out,"\\t");
    }
    else if (bVar1 == 10) {
      fprintf((FILE *)out,"\\n");
    }
    else if (bVar1 == 0xb) {
      fprintf((FILE *)out,"\\v");
    }
    else if (bVar1 == 0xc) {
      fprintf((FILE *)out,"\\f");
    }
    else if (bVar1 == 0xd) {
      fprintf((FILE *)out,"\\r");
    }
    else if (bVar1 == 0x22) {
      fprintf((FILE *)out,"\\\"");
    }
    else if (bVar1 == 0x5c) {
      fprintf((FILE *)out,"\\\\");
    }
    else if ((bVar1 < 0x20) || (0x7e < bVar1)) {
      fprintf((FILE *)out,"\\x%02x",(ulong)bVar1);
    }
    else {
      fprintf((FILE *)out,"%c",(ulong)bVar1);
    }
  }
  fprintf((FILE *)out,"\"");
  return;
}

Assistant:

void print_escaped_astr(FILE *out, struct astr *astr) {
	int i;
	fprintf(out, "\"");
	for (i = 0; i < astr->len; i++) {
		unsigned char c = astr->str[i];
		switch (c) {
			case '\\':
				fprintf(out, "\\\\");
				break;
			case '\"':
				fprintf(out, "\\\"");
				break;
			case '\n':
				fprintf(out, "\\n");
				break;
			case '\f':
				fprintf(out, "\\f");
				break;
			case '\t':
				fprintf(out, "\\t");
				break;
			case '\a':
				fprintf(out, "\\a");
				break;
			case '\v':
				fprintf(out, "\\v");
				break;
			case '\r':
				fprintf(out, "\\r");
				break;
			default:
				if (c >= 0x20 && c <= 0x7e) {
					fprintf(out, "%c", c);
				} else {
					fprintf(out, "\\x%02x", c);
				}
				break;
		}
	}
	fprintf(out, "\"");
}